

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult vmaCreateBufferWithAlignment
                   (VmaAllocator allocator,VkBufferCreateInfo *pBufferCreateInfo,
                   VmaAllocationCreateInfo *pAllocationCreateInfo,VkDeviceSize minAlignment,
                   VkBuffer *pBuffer,VmaAllocation *pAllocation,VmaAllocationInfo *pAllocationInfo)

{
  VmaVulkanFunctions *pVVar1;
  VkAllocationCallbacks *pVVar2;
  unsigned_long *puVar3;
  VmaAllocator_T *in_RDX;
  VkMemoryRequirements *in_RSI;
  VmaAllocator_T *in_RDI;
  undefined8 *in_R8;
  VkBuffer in_R9;
  VkImage in_stack_00000008;
  VkBuffer in_stack_00000010;
  bool in_stack_0000001e;
  bool in_stack_0000001f;
  VkMemoryRequirements *in_stack_00000020;
  VmaAllocator_T *in_stack_00000028;
  VkFlags in_stack_00000070;
  bool prefersDedicatedAllocation;
  VmaAllocationCreateInfo *in_stack_00000078;
  bool requiresDedicatedAllocation;
  VkMemoryRequirements vkMemReq;
  VkResult res;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff2c;
  VmaAllocator_T *this;
  void *pNext;
  VkBuffer pVVar5;
  VkDeviceSize in_stack_ffffffffffffff50;
  VmaAllocation in_stack_ffffffffffffff58;
  VkDevice pVVar6;
  VmaAllocator_T *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  PFN_vkDestroyBuffer p_Var7;
  VmaAllocator_T *in_stack_ffffffffffffff70;
  bool *in_stack_ffffffffffffff80;
  VkMemoryRequirements *memReq;
  uint6 in_stack_ffffffffffffffa0;
  undefined1 local_58 [8];
  unsigned_long local_50 [2];
  VkResult local_3c;
  VkBuffer local_38;
  undefined8 *local_30;
  unsigned_long local_28;
  VmaAllocator_T *local_20;
  VkMemoryRequirements *local_18;
  VmaAllocator_T *local_10;
  VkResult local_4;
  
  if (in_RSI[1].size == 0) {
    local_4 = VK_ERROR_INITIALIZATION_FAILED;
  }
  else if (((in_RSI[1].alignment & 0x20000) == 0) ||
          ((in_RDI->m_UseKhrBufferDeviceAddress & 1U) != 0)) {
    *in_R8 = 0;
    *(undefined8 *)in_R9 = 0;
    local_38 = in_R9;
    local_30 = in_R8;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    pVVar1 = VmaAllocator_T::GetVulkanFunctions(in_RDI);
    pVVar5 = (VkBuffer)pVVar1->vkCreateBuffer;
    pVVar6 = local_10->m_hDevice;
    memReq = local_18;
    pVVar2 = VmaAllocator_T::GetAllocationCallbacks(local_10);
    local_3c = (*(code *)pVVar5)(pVVar6,memReq,pVVar2,local_30);
    local_4 = local_3c;
    if (VK_ERROR_OUT_OF_HOST_MEMORY < local_3c) {
      memset(local_58,0,0x18);
      VmaAllocator_T::GetBufferMemoryRequirements
                ((VmaAllocator_T *)(ulong)in_stack_ffffffffffffffa0,pVVar5,memReq,(bool *)pVVar6,
                 in_stack_ffffffffffffff80);
      puVar3 = std::max<unsigned_long>(local_50,&local_28);
      local_50[0] = *puVar3;
      uVar4 = (undefined4)local_18[1].alignment;
      pNext = (void *)0x1;
      this = local_20;
      pVVar5 = local_38;
      local_3c = VmaAllocator_T::AllocateMemory
                           (in_stack_00000028,in_stack_00000020,in_stack_0000001f,in_stack_0000001e,
                            in_stack_00000010,in_stack_00000008,in_stack_00000070,in_stack_00000078,
                            (VmaSuballocationType)vkMemReq.size,vkMemReq.alignment,
                            (VmaAllocation *)vkMemReq._16_8_);
      if (local_3c < VK_SUCCESS) {
        pVVar1 = VmaAllocator_T::GetVulkanFunctions(local_10);
        p_Var7 = pVVar1->vkDestroyBuffer;
        pVVar6 = local_10->m_hDevice;
        pVVar5 = (VkBuffer)*local_30;
        pVVar2 = VmaAllocator_T::GetAllocationCallbacks(local_10);
        (*p_Var7)(pVVar6,pVVar5,pVVar2);
        *local_30 = 0;
        local_4 = local_3c;
      }
      else {
        if (((undefined1  [5920])*local_20 & (undefined1  [5920])0x80) == (undefined1  [5920])0x0) {
          local_3c = VmaAllocator_T::BindBufferMemory
                               (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                in_stack_ffffffffffffff50,pVVar5,pNext);
        }
        if (local_3c < VK_SUCCESS) {
          VmaAllocator_T::FreeMemory
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (VmaAllocation *)in_stack_ffffffffffffff60);
          *(undefined8 *)local_38 = 0;
          pVVar1 = VmaAllocator_T::GetVulkanFunctions(local_10);
          p_Var7 = pVVar1->vkDestroyBuffer;
          pVVar6 = local_10->m_hDevice;
          pVVar5 = (VkBuffer)*local_30;
          pVVar2 = VmaAllocator_T::GetAllocationCallbacks(local_10);
          (*p_Var7)(pVVar6,pVVar5,pVVar2);
          *local_30 = 0;
          local_4 = local_3c;
        }
        else {
          VmaAllocation_T::InitBufferImageUsage
                    (*(VmaAllocation_T **)local_38,(uint32_t)local_18[1].alignment);
          if (in_stack_00000008 != (VkImage)0x0) {
            VmaAllocator_T::GetAllocationInfo
                      (this,(VmaAllocation)CONCAT44(in_stack_ffffffffffffff2c,uVar4),
                       (VmaAllocationInfo *)0x3037da);
          }
          local_4 = VK_SUCCESS;
        }
      }
    }
  }
  else {
    local_4 = VK_ERROR_INITIALIZATION_FAILED;
  }
  return local_4;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaCreateBufferWithAlignment(
    VmaAllocator allocator,
    const VkBufferCreateInfo* pBufferCreateInfo,
    const VmaAllocationCreateInfo* pAllocationCreateInfo,
    VkDeviceSize minAlignment,
    VkBuffer* pBuffer,
    VmaAllocation* pAllocation,
    VmaAllocationInfo* pAllocationInfo)
{
    VMA_ASSERT(allocator && pBufferCreateInfo && pAllocationCreateInfo && VmaIsPow2(minAlignment) && pBuffer && pAllocation);

    if(pBufferCreateInfo->size == 0)
    {
        return VK_ERROR_INITIALIZATION_FAILED;
    }
    if((pBufferCreateInfo->usage & VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT_COPY) != 0 &&
        !allocator->m_UseKhrBufferDeviceAddress)
    {
        VMA_ASSERT(0 && "Creating a buffer with VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT is not valid if VMA_ALLOCATOR_CREATE_BUFFER_DEVICE_ADDRESS_BIT was not used.");
        return VK_ERROR_INITIALIZATION_FAILED;
    }

    VMA_DEBUG_LOG("vmaCreateBufferWithAlignment");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    *pBuffer = VK_NULL_HANDLE;
    *pAllocation = VK_NULL_HANDLE;

    // 1. Create VkBuffer.
    VkResult res = (*allocator->GetVulkanFunctions().vkCreateBuffer)(
        allocator->m_hDevice,
        pBufferCreateInfo,
        allocator->GetAllocationCallbacks(),
        pBuffer);
    if(res >= 0)
    {
        // 2. vkGetBufferMemoryRequirements.
        VkMemoryRequirements vkMemReq = {};
        bool requiresDedicatedAllocation = false;
        bool prefersDedicatedAllocation  = false;
        allocator->GetBufferMemoryRequirements(*pBuffer, vkMemReq,
            requiresDedicatedAllocation, prefersDedicatedAllocation);

        // 2a. Include minAlignment
        vkMemReq.alignment = VMA_MAX(vkMemReq.alignment, minAlignment);

        // 3. Allocate memory using allocator.
        res = allocator->AllocateMemory(
            vkMemReq,
            requiresDedicatedAllocation,
            prefersDedicatedAllocation,
            *pBuffer, // dedicatedBuffer
            VK_NULL_HANDLE, // dedicatedImage
            pBufferCreateInfo->usage, // dedicatedBufferImageUsage
            *pAllocationCreateInfo,
            VMA_SUBALLOCATION_TYPE_BUFFER,
            1, // allocationCount
            pAllocation);

        if(res >= 0)
        {
            // 3. Bind buffer with memory.
            if((pAllocationCreateInfo->flags & VMA_ALLOCATION_CREATE_DONT_BIND_BIT) == 0)
            {
                res = allocator->BindBufferMemory(*pAllocation, 0, *pBuffer, VMA_NULL);
            }
            if(res >= 0)
            {
                // All steps succeeded.
                #if VMA_STATS_STRING_ENABLED
                    (*pAllocation)->InitBufferImageUsage(pBufferCreateInfo->usage);
                #endif
                if(pAllocationInfo != VMA_NULL)
                {
                    allocator->GetAllocationInfo(*pAllocation, pAllocationInfo);
                }

                return VK_SUCCESS;
            }
            allocator->FreeMemory(
                1, // allocationCount
                pAllocation);
            *pAllocation = VK_NULL_HANDLE;
            (*allocator->GetVulkanFunctions().vkDestroyBuffer)(allocator->m_hDevice, *pBuffer, allocator->GetAllocationCallbacks());
            *pBuffer = VK_NULL_HANDLE;
            return res;
        }
        (*allocator->GetVulkanFunctions().vkDestroyBuffer)(allocator->m_hDevice, *pBuffer, allocator->GetAllocationCallbacks());
        *pBuffer = VK_NULL_HANDLE;
        return res;
    }
    return res;
}